

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O0

base_learner *
ExpReplay::expreplay_setup<(char)99,COST_SENSITIVE::cs_label>(options_i *options,vw *all)

{
  byte bVar1;
  pointer peVar2;
  example *peVar3;
  bool *pbVar4;
  ostream *poVar5;
  base_learner *dat;
  single_learner *base;
  vw *pvVar6;
  vw *in_RSI;
  long *in_RDI;
  learner<ExpReplay::expreplay,_example> *l;
  size_t n;
  option_group_definition new_options;
  free_ptr<ExpReplay::expreplay> er;
  string replay_count_string;
  string replay_string;
  typed_option<unsigned_long> *in_stack_fffffffffffffb18;
  _func_void_expreplay_ptr_learner<char,_example>_ptr_example_ptr *predict;
  vw *in_stack_fffffffffffffb20;
  string *in_stack_fffffffffffffb28;
  typed_option<unsigned_long> *in_stack_fffffffffffffb30;
  _func_void_expreplay_ptr *in_stack_fffffffffffffb38;
  learner<ExpReplay::expreplay,_example> *in_stack_fffffffffffffb40;
  typed_option<unsigned_long> *in_stack_fffffffffffffb68;
  option_group_definition *in_stack_fffffffffffffb70;
  ulong uVar7;
  label_t local_418;
  wclass *local_410;
  wclass *local_408;
  size_t local_400;
  ulong local_3f8;
  allocator local_3e9;
  string local_3e8 [32];
  string local_3c8 [168];
  learner<char,_char> *in_stack_fffffffffffffce0;
  size_t in_stack_fffffffffffffce8;
  allocator local_261;
  string local_260 [32];
  string local_240 [32];
  typed_option<unsigned_long> local_220 [2];
  allocator local_d9;
  string local_d8 [32];
  undefined1 local_b8 [56];
  undefined1 local_80 [16];
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  vw *local_18;
  long *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"replay_",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::operator+=(local_38,'c');
  std::__cxx11::string::string(local_70,local_38);
  std::__cxx11::string::operator+=(local_70,"_count");
  scoped_calloc_or_throw<ExpReplay::expreplay>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Experience Replay",&local_d9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffb20,
             (string *)in_stack_fffffffffffffb18);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::string(local_240,local_38);
  std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
            ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x19876f);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffb28,(unsigned_long *)in_stack_fffffffffffffb20);
  VW::config::typed_option<unsigned_long>::keep(local_220,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_260,
             "use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost sensitive] with specified buffer size"
             ,&local_261);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb20,
             (string *)in_stack_fffffffffffffb18);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  std::__cxx11::string::string(local_3c8,local_70);
  std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
            ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x198853);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffb28,(unsigned_long *)in_stack_fffffffffffffb20);
  VW::config::typed_option<unsigned_long>::default_value
            (in_stack_fffffffffffffb30,(unsigned_long)in_stack_fffffffffffffb28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3e8,
             "how many times (in expectation) should each example be played (default: 1 = permuting)"
             ,&local_3e9);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb20,
             (string *)in_stack_fffffffffffffb18);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb20);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb20);
  std::__cxx11::string::~string(local_3c8);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb20);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb20);
  std::__cxx11::string::~string(local_240);
  (**(code **)*local_10)(local_10,local_b8);
  bVar1 = (**(code **)(*local_10 + 8))(local_10,local_38);
  if (((bVar1 & 1) == 0) ||
     (peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1989df),
     pvVar6 = local_18, peVar2->N == 0)) {
    local_8 = (base_learner *)0x0;
  }
  else {
    peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x198c39);
    peVar2->all = pvVar6;
    std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
              ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x198c4b);
    peVar3 = VW::alloc_examples((size_t)in_stack_fffffffffffffb28,(size_t)in_stack_fffffffffffffb20)
    ;
    peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x198c6d);
    peVar2->buf = peVar3;
    local_3f8 = 0;
    while (uVar7 = local_3f8,
          peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                             ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x198c9c),
          uVar7 < peVar2->N) {
      v_init<COST_SENSITIVE::wclass>();
      peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x198cca);
      peVar3 = peVar2->buf;
      peVar3[local_3f8].l.multi = local_418;
      peVar3[local_3f8].l.cs.costs._end = local_410;
      peVar3[local_3f8].l.cs.costs.end_array = local_408;
      peVar3[local_3f8].l.cs.costs.erase_count = local_400;
      local_3f8 = local_3f8 + 1;
    }
    std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
              ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x198d3f);
    pbVar4 = calloc_or_throw<bool>(in_stack_fffffffffffffce8);
    peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x198d5c);
    peVar2->filled = pbVar4;
    if ((local_18->quiet & 1U) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"experience replay level=");
      poVar5 = std::operator<<(poVar5,'c');
      poVar5 = std::operator<<(poVar5,", buffer=");
      peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x198dcf);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,peVar2->N);
      in_stack_fffffffffffffb40 =
           (learner<ExpReplay::expreplay,_example> *)std::operator<<(poVar5,", replay count=");
      peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x198e09);
      in_stack_fffffffffffffb38 =
           (_func_void_expreplay_ptr *)
           std::ostream::operator<<(in_stack_fffffffffffffb40,peVar2->replay_count);
      std::ostream::operator<<(in_stack_fffffffffffffb38,std::endl<char,std::char_traits<char>>);
    }
    dat = setup_base((options_i *)in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    base = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffce0);
    predict = (_func_void_expreplay_ptr_learner<char,_example>_ptr_example_ptr *)local_80;
    peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x198e71);
    peVar2->base = base;
    std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
              ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x198e83);
    pvVar6 = (vw *)LEARNER::
                   init_learner<ExpReplay::expreplay,example,LEARNER::learner<char,example>>
                             ((free_ptr<ExpReplay::expreplay> *)dat,base,
                              (_func_void_expreplay_ptr_learner<char,_example>_ptr_example_ptr *)
                              in_stack_fffffffffffffb20,predict);
    in_stack_fffffffffffffb20 = pvVar6;
    LEARNER::learner<ExpReplay::expreplay,_example>::set_finish
              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    LEARNER::learner<ExpReplay::expreplay,_example>::set_end_pass
              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    local_8 = LEARNER::make_base<ExpReplay::expreplay,example>
                        ((learner<ExpReplay::expreplay,_example> *)pvVar6);
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffb20);
  std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)in_stack_fffffffffffffb20);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return local_8;
}

Assistant:

LEARNER::base_learner* expreplay_setup(VW::config::options_i& options, vw& all)
{
  std::string replay_string = "replay_";
  replay_string += er_level;
  std::string replay_count_string = replay_string;
  replay_count_string += "_count";

  auto er = scoped_calloc_or_throw<expreplay>();
  VW::config::option_group_definition new_options("Experience Replay");
  new_options
      .add(VW::config::make_option(replay_string, er->N)
               .keep()
               .help("use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost "
                     "sensitive] with specified buffer size"))
      .add(VW::config::make_option(replay_count_string, er->replay_count)
               .default_value(1)
               .help("how many times (in expectation) should each example be played (default: 1 = permuting)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied(replay_string) || er->N == 0)
    return nullptr;

  er->all = &all;
  er->buf = VW::alloc_examples(1, er->N);

  if (er_level == 'c')
    for (size_t n = 0; n < er->N; n++) er->buf[n].l.cs.costs = v_init<COST_SENSITIVE::wclass>();

  er->filled = calloc_or_throw<bool>(er->N);

  if (!all.quiet)
    std::cerr << "experience replay level=" << er_level << ", buffer=" << er->N << ", replay count=" << er->replay_count
              << std::endl;

  er->base = LEARNER::as_singleline(setup_base(options, all));
  LEARNER::learner<expreplay, example>* l =
      &init_learner(er, er->base, predict_or_learn<true, lp>, predict_or_learn<false, lp>);
  l->set_finish(finish<lp>);
  l->set_end_pass(end_pass);

  return make_base(*l);
}